

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase93::run(TestCase93 *this)

{
  Reader reader;
  Builder builder_00;
  Reader reader_00;
  Reader reader_01;
  Reader local_198;
  Builder root;
  Reader local_130;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
            (&root,&builder.super_MessageBuilder,(StructSchema)0x655118);
  DynamicStruct::Builder::asReader(&local_130,&root);
  reader_01.reader.segment = local_130.reader.segment;
  reader_01.schema.super_Schema.raw = local_130.schema.super_Schema.raw;
  reader_01.reader.capTable = local_130.reader.capTable;
  reader_01.reader.data = local_130.reader.data;
  reader_01.reader.pointers = local_130.reader.pointers;
  reader_01.reader.dataSize = local_130.reader.dataSize;
  reader_01.reader.pointerCount = local_130.reader.pointerCount;
  reader_01.reader._38_2_ = local_130.reader._38_2_;
  reader_01.reader.nestingLimit = local_130.reader.nestingLimit;
  reader_01.reader._44_4_ = local_130.reader._44_4_;
  checkDynamicTestMessageAllZero(reader_01);
  DynamicStruct::Builder::asReader(&local_198,&root);
  Schema::requireUsableAs<capnproto_test::capnp::test::TestAllTypes>((Schema *)&local_198);
  reader._reader.capTable = local_198.reader.capTable;
  reader._reader.segment = local_198.reader.segment;
  reader._reader.data = local_198.reader.data;
  reader._reader.pointers = local_198.reader.pointers;
  reader._reader.dataSize = local_198.reader.dataSize;
  reader._reader.pointerCount = local_198.reader.pointerCount;
  reader._reader._38_2_ = local_198.reader._38_2_;
  reader._reader.nestingLimit = local_198.reader.nestingLimit;
  reader._reader._44_4_ = local_198.reader._44_4_;
  checkTestMessageAllZero(reader);
  builder_00.builder.segment = root.builder.segment;
  builder_00.schema = (StructSchema)(StructSchema)root.schema.super_Schema.raw;
  builder_00.builder.capTable = root.builder.capTable;
  builder_00.builder.data = root.builder.data;
  builder_00.builder.pointers = root.builder.pointers;
  builder_00.builder.dataSize = root.builder.dataSize;
  builder_00.builder.pointerCount = root.builder.pointerCount;
  builder_00.builder._38_2_ = root.builder._38_2_;
  checkDynamicTestMessageAllZero(builder_00);
  DynamicStruct::Builder::asReader(&local_198,&root);
  Schema::requireUsableAs<capnproto_test::capnp::test::TestAllTypes>((Schema *)&local_198);
  reader_00._reader.capTable = local_198.reader.capTable;
  reader_00._reader.segment = local_198.reader.segment;
  reader_00._reader.data = local_198.reader.data;
  reader_00._reader.pointers = local_198.reader.pointers;
  reader_00._reader.dataSize = local_198.reader.dataSize;
  reader_00._reader.pointerCount = local_198.reader.pointerCount;
  reader_00._reader._38_2_ = local_198.reader._38_2_;
  reader_00._reader.nestingLimit = local_198.reader.nestingLimit;
  reader_00._reader._44_4_ = local_198.reader._44_4_;
  checkTestMessageAllZero(reader_00);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(DynamicApi, Zero) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestAllTypes>());

  checkDynamicTestMessageAllZero(root.asReader());
  checkTestMessageAllZero(root.asReader().as<TestAllTypes>());
  checkDynamicTestMessageAllZero(root);
  checkTestMessageAllZero(root.asReader().as<TestAllTypes>());
}